

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O1

int Abc_ResCheckNonStrict(char *Pattern,int nVars,int nBits)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar9 = 1 << ((char)nBits - 1U & 0x1f);
  if (nVars < 1) {
    return 0;
  }
  uVar8 = 1 << ((byte)nVars & 0x1f);
  uVar4 = 1;
  if (1 < (int)uVar8) {
    uVar4 = (ulong)uVar8;
  }
  iVar2 = 0;
  iVar3 = 0;
  do {
    uVar5 = 0;
    if (nVars != 0x1f) {
      uVar6 = 0;
      uVar12 = 0;
      uVar13 = 0;
      do {
        cVar1 = Pattern[uVar6];
        uVar7 = uVar6;
        if ((1 << ((byte)iVar3 & 0x1f) & (uint)uVar6) == 0) {
          iVar11 = (int)uVar13;
          if (0 < iVar11) {
            uVar10 = 0;
            do {
              if (Abc_ResCheckNonStrict::Pat0[uVar10] == cVar1) goto LAB_0023f020;
              uVar10 = uVar10 + 1;
            } while (uVar13 != uVar10);
          }
          Abc_ResCheckNonStrict::Pat0[iVar11] = cVar1;
          if (iVar9 <= iVar11) break;
          uVar13 = (ulong)(iVar11 + 1);
        }
        else {
          iVar11 = (int)uVar12;
          if (0 < iVar11) {
            uVar10 = 0;
            do {
              if (Abc_ResCheckNonStrict::Pat1[uVar10] == cVar1) goto LAB_0023f020;
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          Abc_ResCheckNonStrict::Pat1[iVar11] = cVar1;
          if (iVar9 <= iVar11) break;
          uVar12 = (ulong)(iVar11 + 1);
        }
LAB_0023f020:
        uVar6 = uVar6 + 1;
        uVar7 = uVar4;
      } while (uVar6 != uVar4);
      uVar5 = (uint)uVar7;
    }
    iVar2 = iVar2 + (uint)(uVar5 == uVar8);
    iVar3 = iVar3 + 1;
    if (iVar3 == nVars) {
      return iVar2;
    }
  } while( true );
}

Assistant:

int Abc_ResCheckNonStrict( char Pattern[], int nVars, int nBits )
{
    static char Pat0[256], Pat1[256];
    int v, m, nPats0, nPats1, nNumber = (1 << (nBits - 1));
    int Result = 0;
    for ( v = 0; v < nVars; v++ )
    {
        nPats0 = nPats1 = 0;
        for ( m = 0; m < (1<<nVars); m++ )
        {
            if ( (m & (1 << v)) == 0 )
            {
                if ( Abc_ResCheckUnique( Pat0, nPats0, Pattern[m] ) )
                {
                    Pat0[ nPats0++ ] = Pattern[m];
                    if ( nPats0 > nNumber )
                        break;
                }
            }
            else
            {
                if ( Abc_ResCheckUnique( Pat1, nPats1, Pattern[m] ) )
                {
                    Pat1[ nPats1++ ] = Pattern[m];
                    if ( nPats1 > nNumber )
                        break;
                }
            }
        }
        if ( m == (1<<nVars) )
            Result++;
    }
    return Result;
}